

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

int __thiscall OpenMD::DumpReader::readStuntDoubles(DumpReader *this,istream *inputStream)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  char *in_RSI;
  long in_RDI;
  int nSD;
  string line;
  string *in_stack_000003d8;
  DumpReader *in_stack_000003e0;
  int local_48;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::istream::getline(in_RSI,in_RDI + 0x256);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x30731b);
  if (lVar2 == -1) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Missing <StuntDoubles>\n");
    painCave.isFatal = 1;
    simError();
  }
  local_48 = 0;
  while( true ) {
    plVar3 = (long *)std::istream::getline(in_RSI,in_RDI + 0x256);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,(char *)(in_RDI + 0x256));
    lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x307354);
    if (lVar2 != -1) break;
    parseDumpLine(in_stack_000003e0,in_stack_000003d8);
    local_48 = local_48 + 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return local_48;
}

Assistant:

int DumpReader::readStuntDoubles(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<StuntDoubles>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <StuntDoubles>\n");
      painCave.isFatal = 1;
      simError();
    }

    int nSD = 0;

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</StuntDoubles>") != std::string::npos) { break; }

      parseDumpLine(line);
      nSD++;
    }

    return nSD;
  }